

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O3

void __thiscall
so_5::impl::local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_enabled_base>::
do_deliver_service_request_to_subscriber
          (local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_enabled_base> *this,
          deliver_op_tracer *tracer,subscriber_info_t *agent_info,type_index *msg_type,
          message_ref_t *message,uint overlimit_reaction_deep)

{
  undefined8 uVar1;
  anon_class_40_5_1f61f8e0 delivery_action;
  int iVar2;
  long *plVar3;
  delivery_possibility_t status;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  plVar3 = (long *)__dynamic_cast(message->m_obj,&message_t::typeinfo,
                                  &msg_service_request_base_t::typeinfo,0);
  if (plVar3 == (long *)0x0) {
    __cxa_bad_cast();
  }
  uVar1 = (**(code **)(*plVar3 + 0x30))(plVar3);
  if (agent_info->m_state == only_filter) {
    status = no_subscription;
LAB_00209a01:
    msg_tracing_helpers::tracing_enabled_base::deliver_op_tracer::message_rejected
              (tracer,agent_info->m_agent,status);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,
               "no service handlers (no subscribers for message or subscriber is blocked by delivery filter)"
               ,"");
    exception_t::raise(0x248bfe);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  else {
    if (agent_info->m_state == subscriptions_and_filter) {
      iVar2 = (*agent_info->m_filter->_vptr_delivery_filter_t[2])
                        (agent_info->m_filter,agent_info->m_agent,uVar1);
      status = disabled_by_delivery_filter;
      if ((char)iVar2 == '\0') goto LAB_00209a01;
    }
    delivery_action.agent_info = agent_info;
    delivery_action.tracer = tracer;
    delivery_action.this = this;
    delivery_action.msg_type = msg_type;
    delivery_action.message = message;
    message_limit::impl::
    try_to_deliver_to_agent<so_5::impl::local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_enabled_base>::do_deliver_service_request_to_subscriber(so_5::impl::msg_tracing_helpers::tracing_enabled_base::deliver_op_tracer_const&,so_5::impl::local_mbox_details::subscriber_info_t_const&,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,unsigned_int)const::_lambda()_1_>
              (service_request,agent_info->m_agent,agent_info->m_limit,msg_type,message,
               overlimit_reaction_deep,&tracer->super_action_msg_tracer_t,delivery_action);
  }
  return;
}

Assistant:

void
		do_deliver_service_request_to_subscriber(
			typename TRACING_BASE::deliver_op_tracer const & tracer,
			const local_mbox_details::subscriber_info_t & agent_info,
			const std::type_index & msg_type,
			const message_ref_t & message,
			unsigned int overlimit_reaction_deep ) const
			{
				auto & svc_request_param =
					dynamic_cast< msg_service_request_base_t & >( *message )
							.query_param();

				const auto delivery_status =
						agent_info.must_be_delivered( svc_request_param );

				if( delivery_possibility_t::must_be_delivered == delivery_status )
					{
						using namespace so_5::message_limit::impl;

						try_to_deliver_to_agent(
								invocation_type_t::service_request,
								agent_info.subscriber_reference(),
								agent_info.limit(),
								msg_type,
								message,
								overlimit_reaction_deep,
								tracer.overlimit_tracer(),
								[&] {
									tracer.push_to_queue( agent_info.subscriber_pointer() );

									agent_t::call_push_service_request(
											agent_info.subscriber_reference(),
											agent_info.limit(),
											m_id,
											msg_type,
											message );
								} );
					}
				else
					{
						tracer.message_rejected(
								agent_info.subscriber_pointer(),
								delivery_status );

						SO_5_THROW_EXCEPTION(
								so_5::rc_no_svc_handlers,
								"no service handlers (no subscribers for message or "
								"subscriber is blocked by delivery filter)" );
					}
			}